

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O2

int pkey_ctrl_gost(EVP_PKEY *pkey,int op,long arg1,void *arg2)

{
  X509_ALGOR *pXVar1;
  int iVar2;
  uint uVar3;
  ASN1_STRING *pval;
  EVP_PKEY_CTX *ctx;
  char *name;
  EVP_CIPHER *cipher;
  void *pvVar4;
  EVP_PKEY *peer;
  ASN1_STRING *a;
  GOST_KEY_PARAMS *a_00;
  ASN1_STRING *pval_00;
  ASN1_OBJECT *pAVar5;
  EVP_CIPHER_CTX *pEVar6;
  uchar *penc;
  int iVar7;
  X509_PUBKEY *pub;
  int iVar8;
  bool bVar9;
  int ptype;
  X509_ALGOR *alg1;
  ASN1_BIT_STRING *pubkey;
  ASN1_OBJECT *local_c0;
  X509_ALGOR *pubalg;
  ASN1_OCTET_STRING *ukm;
  int local_a4;
  X509_ALGOR *alg2;
  void *local_98;
  X509_ALGOR *alg;
  void *local_88;
  size_t shared_key_size;
  uchar shared_key [64];
  
  iVar2 = EVP_PKEY_get_base_id();
  alg1 = (X509_ALGOR *)0x0;
  alg2 = (X509_ALGOR *)0x0;
  if ((iVar2 - 0x32bU < 7) && ((0x43U >> (iVar2 - 0x32bU & 0x1f) & 1) != 0)) {
    iVar7 = 0x329;
  }
  else if (iVar2 == 0x3d4) {
    iVar7 = 0x3d7;
  }
  else {
    if (iVar2 != 0x3d3) {
      return -1;
    }
    iVar7 = 0x3d6;
  }
  iVar8 = -2;
  switch(op) {
  case 1:
    if (arg1 != 0) {
      return 1;
    }
    PKCS7_SIGNER_INFO_get0_algs
              ((PKCS7_SIGNER_INFO *)arg2,(EVP_PKEY **)0x0,(X509_ALGOR **)&alg1,(X509_ALGOR **)&alg2)
    ;
    goto LAB_0010f398;
  case 2:
    if (arg1 == 0) {
      pval = encode_gost_algor_params(pkey);
      if (pval == (ASN1_STRING *)0x0) {
        return -1;
      }
      PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)arg2,(X509_ALGOR **)&alg1);
      pXVar1 = alg1;
      iVar2 = EVP_PKEY_get_id(pkey);
      pAVar5 = OBJ_nid2obj(iVar2);
      X509_ALGOR_set0((X509_ALGOR *)pXVar1,pAVar5,0x10,pval);
    }
    iVar8 = 1;
    break;
  case 3:
    *(int *)arg2 = iVar7;
    iVar8 = 2;
    break;
  case 5:
    if (arg1 != 0) {
      return 1;
    }
    CMS_SignerInfo_get0_algs
              ((CMS_SignerInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,(X509_ALGOR **)&alg1,
               (X509_ALGOR **)&alg2);
LAB_0010f398:
    pXVar1 = alg1;
    iVar8 = 1;
    pAVar5 = OBJ_nid2obj(iVar7);
    X509_ALGOR_set0((X509_ALGOR *)pXVar1,pAVar5,5,(void *)0x0);
    pXVar1 = alg2;
    pAVar5 = OBJ_nid2obj(iVar2);
    X509_ALGOR_set0((X509_ALGOR *)pXVar1,pAVar5,5,(void *)0x0);
    break;
  case 7:
    ctx = (EVP_PKEY_CTX *)CMS_RecipientInfo_get0_pkey_ctx(arg2);
    if (arg1 != 0) {
      if (ctx == (EVP_PKEY_CTX *)0x0) {
        return 0;
      }
      iVar2 = CMS_RecipientInfo_type((CMS_RecipientInfo *)arg2);
      if (iVar2 == 0) {
        pvVar4 = EVP_PKEY_CTX_get_data(ctx);
        CMS_RecipientInfo_ktri_get0_algs
                  ((CMS_RecipientInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,(X509_ALGOR **)shared_key
                  );
        iVar2 = OBJ_obj2nid(*(ASN1_OBJECT **)shared_key._0_8_);
        if (((iVar2 - 0x3d3U < 2) || (iVar2 == 0x32b)) || (iVar2 == 0x331)) {
          *(undefined4 *)((long)pvVar4 + 0x3c) = 0x32d;
        }
        else if (iVar2 == 0x49d) {
          *(undefined4 *)((long)pvVar4 + 0x3c) = 0x4a4;
        }
        else {
          if (iVar2 != 0x49f) {
            ERR_GOST_error(0x9d,0x89,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                           ,0x164);
            return 0;
          }
          *(undefined4 *)((long)pvVar4 + 0x3c) = 0x3f5;
        }
        goto LAB_0010f73b;
      }
      if (iVar2 != 1) {
        ERR_GOST_error(0x9b,0x89,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x176);
        return 0;
      }
      pubalg = (X509_ALGOR *)0x0;
      pubkey = (ASN1_BIT_STRING *)0x0;
      shared_key_size = 0x40;
      iVar2 = CMS_RecipientInfo_kari_get0_alg(arg2,&alg,&ukm);
      bVar9 = true;
      if (((iVar2 != 0) &&
          (iVar2 = CMS_RecipientInfo_kari_get0_orig_id(arg2,&pubalg,&pubkey,0,0,0), iVar2 != 0)) &&
         (uVar3 = OBJ_obj2nid((ASN1_OBJECT *)alg->algorithm), alg->parameter->type == 0x10)) {
        if ((uVar3 | 2) == 0x49f) {
          name = OBJ_nid2sn(uVar3);
          cipher = EVP_get_cipherbyname(name);
          if (cipher != (EVP_CIPHER *)0x0) {
            iVar2 = ASN1_STRING_length((ASN1_STRING *)ukm);
            pvVar4 = (void *)ASN1_STRING_get0_data(ukm);
            iVar2 = EVP_PKEY_CTX_ctrl(ctx,-1,-1,8,iVar2,pvVar4);
            if (iVar2 < 1) goto LAB_0010f7a9;
            peer = (EVP_PKEY *)0x0;
            if (pubkey == (ASN1_BIT_STRING *)0x0) {
              pub = (X509_PUBKEY *)0x0;
LAB_0010f7cc:
              iVar2 = EVP_PKEY_derive(ctx,shared_key,&shared_key_size);
              if (0 < iVar2) {
                pEVar6 = (EVP_CIPHER_CTX *)CMS_RecipientInfo_kari_get0_ctx(arg2);
                EVP_CIPHER_CTX_set_flags(pEVar6,1);
                pEVar6 = (EVP_CIPHER_CTX *)CMS_RecipientInfo_kari_get0_ctx(arg2);
                iVar2 = EVP_DecryptInit_ex(pEVar6,cipher,(ENGINE *)0x0,shared_key,ukm->data + 0x18);
                bVar9 = iVar2 == 0;
                uVar3 = (uint)!bVar9;
                goto LAB_0010f7af;
              }
              iVar7 = 0x69;
              iVar2 = 0x139;
            }
            else {
              pub = (X509_PUBKEY *)0x0;
              if (pubalg == (X509_ALGOR *)0x0) goto LAB_0010f7cc;
              shared_key[0] = '\0';
              shared_key[1] = '\0';
              shared_key[2] = '\0';
              shared_key[3] = '\0';
              shared_key[4] = '\0';
              shared_key[5] = '\0';
              shared_key[6] = '\0';
              shared_key[7] = '\0';
              ptype = 0;
              local_98 = (void *)0x0;
              peer = EVP_PKEY_new();
              pub = X509_PUBKEY_new();
              if (pub == (X509_PUBKEY *)0x0 || peer == (EVP_PKEY *)0x0) {
                iVar7 = 0xc0100;
                iVar2 = 0x11f;
              }
              else {
                X509_ALGOR_get0((ASN1_OBJECT **)shared_key,&ptype,&local_98,(X509_ALGOR *)pubalg);
                local_c0 = (ASN1_OBJECT *)shared_key._0_8_;
                local_a4 = ptype;
                local_88 = local_98;
                penc = (uchar *)ASN1_STRING_get0_data(pubkey);
                iVar2 = ASN1_STRING_length((ASN1_STRING *)pubkey);
                iVar2 = X509_PUBKEY_set0_param(pub,local_c0,local_a4,local_88,penc,iVar2);
                if (iVar2 == 0) {
                  iVar7 = 0x7d;
                  iVar2 = 0x129;
                }
                else {
                  iVar2 = pub_decode_gost_ec((EVP_PKEY *)peer,(X509_PUBKEY *)pub);
                  if (iVar2 < 1) {
                    iVar7 = 0x8a;
                    iVar2 = 0x12e;
                  }
                  else {
                    iVar2 = EVP_PKEY_derive_set_peer(ctx,peer);
                    if (0 < iVar2) goto LAB_0010f7cc;
                    iVar7 = 0x8b;
                    iVar2 = 0x133;
                  }
                }
              }
            }
            ERR_GOST_error(0x9c,iVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                           ,iVar2);
            uVar3 = 0;
            goto LAB_0010f7af;
          }
        }
        ERR_GOST_error(0x9c,0x67,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x10e);
      }
LAB_0010f7a9:
      uVar3 = 0;
      peer = (EVP_PKEY *)0x0;
      pub = (X509_PUBKEY *)0x0;
LAB_0010f7af:
      EVP_PKEY_free(peer);
      if (bVar9) {
        X509_PUBKEY_free(pub);
        return uVar3;
      }
      return uVar3;
    }
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      return 0;
    }
    pvVar4 = EVP_PKEY_CTX_get_data(ctx);
    iVar7 = *(int *)((long)pvVar4 + 0x3c);
    if ((iVar7 == 0x4a4) || (iVar7 == 0x3f5)) {
      local_c0 = (ASN1_OBJECT *)CONCAT71(local_c0._1_7_,iVar7 != 0x4a4);
      iVar2 = EVP_PKEY_get_base_id(pkey);
      a = ASN1_STRING_new();
      a_00 = GOST_KEY_PARAMS_new();
      if (a_00 == (GOST_KEY_PARAMS *)0x0 || a == (ASN1_STRING *)0x0) {
        iVar2 = 0x185;
LAB_0010f6e5:
        ERR_GOST_error(0xa1,0xc0100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,iVar2);
        pval_00 = (ASN1_STRING *)0x0;
      }
      else {
        pAVar5 = OBJ_nid2obj(iVar2 == 0x3d3 ^ 0x3e1);
        a_00->key_params = (ASN1_OBJECT *)pAVar5;
        iVar2 = i2d_GOST_KEY_PARAMS(a_00,&a->data);
        a->length = iVar2;
        if (iVar2 < 0) {
          iVar2 = 0x18d;
          goto LAB_0010f6e5;
        }
        a->type = 0x10;
        pval_00 = a;
      }
      GOST_KEY_PARAMS_free(a_00);
      if (pval_00 == (ASN1_STRING *)0x0) {
        ASN1_STRING_free(a);
        return -1;
      }
      iVar2 = (uint)(byte)local_c0 * 2 + 0x49d;
    }
    else {
      pval_00 = (ASN1_STRING *)encode_gost_algor_params(pkey);
      if (pval_00 == (ASN1_STRING *)0x0) {
        return -1;
      }
    }
    CMS_RecipientInfo_ktri_get0_algs
              ((CMS_RecipientInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,(X509_ALGOR **)&alg1);
    pXVar1 = alg1;
    pAVar5 = OBJ_nid2obj(iVar2);
    X509_ALGOR_set0((X509_ALGOR *)pXVar1,pAVar5,0x10,pval_00);
    goto LAB_0010f73b;
  case 8:
    *(undefined4 *)arg2 = 0;
    goto LAB_0010f73b;
  case 0xb:
    if (1 < (ulong)arg1) {
      return 0;
    }
    *(undefined4 *)arg2 = 1;
LAB_0010f73b:
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static int pkey_ctrl_gost(EVP_PKEY *pkey, int op, long arg1, void *arg2)
{
    int nid = EVP_PKEY_base_id(pkey), md_nid = NID_undef;
    X509_ALGOR *alg1 = NULL, *alg2 = NULL;

    switch (nid) {
    case NID_id_GostR3410_2012_512:
        md_nid = NID_id_GostR3411_2012_512;
        break;
    case NID_id_GostR3410_2012_256:
        md_nid = NID_id_GostR3411_2012_256;
        break;
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_94:
        md_nid = NID_id_GostR3411_94;
        break;
    default:
        return -1;
    }

    switch (op) {
    case ASN1_PKEY_CTRL_PKCS7_SIGN:
        if (arg1 == 0) {
            PKCS7_SIGNER_INFO_get0_algs((PKCS7_SIGNER_INFO *)arg2, NULL,
                                        &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_SIGN:
        if (arg1 == 0) {
            CMS_SignerInfo_get0_algs((CMS_SignerInfo *)arg2, NULL, NULL,
                                     &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#endif
    case ASN1_PKEY_CTRL_PKCS7_ENCRYPT:
        if (arg1 == 0) { /* Encryption */
            ASN1_STRING *params = encode_gost_algor_params(pkey);
            if (!params) {
                return -1;
            }
            PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)arg2, &alg1);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(EVP_PKEY_id(pkey)),
                            V_ASN1_SEQUENCE, params);
				}
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_ENVELOPE:
        if (arg1 == 0) {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;

          struct gost_pmeth_data *gctx = NULL;
          ASN1_STRING *params = NULL;

          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
            return 0;

          gctx = EVP_PKEY_CTX_get_data(pctx);

          switch (gctx->cipher_nid) {
            case NID_magma_ctr:
            case NID_kuznyechik_ctr:
              {
                int ka_nid;

                nid = (gctx->cipher_nid == NID_magma_ctr) ? NID_magma_kexp15 :
                  NID_kuznyechik_kexp15;

                ka_nid = (EVP_PKEY_base_id(pkey) == NID_id_GostR3410_2012_256) ?
                  NID_id_tc26_agreement_gost_3410_2012_256 : NID_id_tc26_agreement_gost_3410_2012_512;

                params = gost_encode_cms_params(ka_nid);
              }
              break;
            default:
                params = encode_gost_algor_params(pkey);
              break;
          }

          if (params == NULL)
              return -1;

          CMS_RecipientInfo_ktri_get0_algs((CMS_RecipientInfo *)arg2, NULL,
              NULL, &alg1);
          X509_ALGOR_set0(alg1, OBJ_nid2obj(nid), V_ASN1_SEQUENCE, params);
        } else {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;
          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
              return 0;
          return gost_cms_set_shared_info(pctx, ri);
        }
        return 1;
#ifdef ASN1_PKEY_CTRL_CMS_RI_TYPE
  case ASN1_PKEY_CTRL_CMS_RI_TYPE:
        *(int *)arg2 = CMS_RECIPINFO_TRANS;
        return 1;
	case ASN1_PKEY_CTRL_CMS_IS_RI_TYPE_SUPPORTED:
			if (arg1 == CMS_RECIPINFO_AGREE || arg1 == CMS_RECIPINFO_TRANS) {
          *(int *)arg2 = 1;
				  return 1;
      }
			else
				  return 0;
			break;
#endif
#endif
    case ASN1_PKEY_CTRL_DEFAULT_MD_NID:
        *(int *)arg2 = md_nid;
        return 2;
    }

    return -2;
}